

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectAnds(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_34;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  int nNodes_local;
  int *pNodes_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vNodes);
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar2);
  for (local_34 = 0; local_34 < nNodes; local_34 = local_34 + 1) {
    pGVar2 = Gia_ManObj(p,pNodes[local_34]);
    iVar1 = Gia_ObjIsCo(pGVar2);
    if (iVar1 == 0) {
      Gia_ManCollectAnds_rec(p,pGVar2,vNodes);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGVar2);
      Gia_ManCollectAnds_rec(p,pGVar2,vNodes);
    }
  }
  return;
}

Assistant:

void Gia_ManCollectAnds( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    int i; 
    Vec_IntClear( vNodes );
//    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectAnds_rec( p, Gia_ObjFanin0(pObj), vNodes );
        else
            Gia_ManCollectAnds_rec( p, pObj, vNodes );
    }
}